

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

void NetworkDataType::deserializedata<GlobalStimulationSettings::CurrentScaling>
               (binarydata *data,CurrentScaling *args)

{
  Options OVar1;
  _Ios_Openmode _Var2;
  PortableBinaryInputArchive archive;
  stringstream stream;
  binarydata *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  Options *in_stack_fffffffffffffd40;
  istream *in_stack_fffffffffffffd48;
  PortableBinaryInputArchive *in_stack_fffffffffffffd50;
  string local_1b8 [32];
  stringstream local_198 [408];
  
  binarydata::operator_cast_to_string(in_stack_fffffffffffffd18);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,local_1b8,_Var2);
  std::__cxx11::string::~string(local_1b8);
  OVar1 = cereal::PortableBinaryInputArchive::Options::Default();
  cereal::PortableBinaryInputArchive::PortableBinaryInputArchive
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::operator()
            ((InputArchive<cereal::PortableBinaryInputArchive,_1U> *)
             CONCAT17(OVar1.itsInputEndianness,in_stack_fffffffffffffd20),
             (CurrentScaling *)in_stack_fffffffffffffd18);
  cereal::PortableBinaryInputArchive::~PortableBinaryInputArchive
            ((PortableBinaryInputArchive *)0x386a7d);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

static void deserializedata(const binarydata &data, T & ... args){
        std::stringstream stream(data);
        cereal::PortableBinaryInputArchive archive(stream);
        archive(args...);
    }